

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_df027::KeywordsSink::put
          (KeywordsSink *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *errorCode)

{
  UList *list;
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  size_t sVar4;
  undefined7 in_register_00000009;
  int i;
  int32_t len;
  CharString defcoll;
  ResourceTable collations;
  char *local_108;
  int32_t local_fc;
  ConstChar16Ptr local_f8;
  UErrorCode *local_f0;
  char16_t *local_e8;
  CharString local_d8;
  UnicodeString local_98;
  ResourceTable local_58;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    local_108 = key;
    (*(value->super_UObject)._vptr_UObject[0xb])
              (&local_58,value,errorCode,CONCAT71(in_register_00000009,param_3));
    UVar1 = icu_63::ResourceTable::getKeyAndValue(&local_58,0,&local_108,value);
    if (UVar1 != '\0') {
      i = 1;
      local_f0 = errorCode;
      do {
        iVar2 = (*(value->super_UObject)._vptr_UObject[3])(value);
        pcVar3 = local_108;
        if (iVar2 == 2) {
          iVar2 = strncmp(local_108,"private-",8);
          if (iVar2 != 0) {
            list = this->values;
            sVar4 = strlen(pcVar3);
            errorCode = local_f0;
            UVar1 = ulist_containsString_63(list,pcVar3,(int32_t)sVar4);
            if (UVar1 == '\0') {
              ulist_addItemEndList_63(this->values,local_108,'\0',errorCode);
            }
          }
        }
        else if (((iVar2 == 0) && (this->hasDefault == '\0')) &&
                (iVar2 = strcmp(local_108,"default"), iVar2 == 0)) {
          icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&local_d8.buffer);
          local_d8.len = 0;
          *local_d8.buffer.ptr = '\0';
          local_fc = 0;
          iVar2 = (*(value->super_UObject)._vptr_UObject[4])(value,&local_fc,errorCode);
          local_f8.p_ = (char16_t *)CONCAT44(extraout_var,iVar2);
          icu_63::UnicodeString::UnicodeString(&local_98,'\x01',&local_f8,local_fc);
          local_e8 = local_f8.p_;
          icu_63::CharString::appendInvariantChars(&local_d8,&local_98,errorCode);
          icu_63::UnicodeString::~UnicodeString(&local_98);
          if ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) && (local_d8.len != 0)) {
            pcVar3 = uprv_strdup_63(local_d8.buffer.ptr);
            if (pcVar3 == (char *)0x0) {
              *errorCode = U_MEMORY_ALLOCATION_ERROR;
              icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_d8.buffer);
              return;
            }
            ulist_removeString_63(this->values,local_d8.buffer.ptr);
            ulist_addItemBeginList_63(this->values,pcVar3,'\x01',errorCode);
            this->hasDefault = '\x01';
          }
          icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_d8.buffer);
        }
        if (U_ZERO_ERROR < *errorCode) {
          return;
        }
        UVar1 = icu_63::ResourceTable::getKeyAndValue(&local_58,i,&local_108,value);
        i = i + 1;
      } while (UVar1 != '\0');
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool /*noFallback*/,
                     UErrorCode &errorCode) {
        if (U_FAILURE(errorCode)) { return; }
        ResourceTable collations = value.getTable(errorCode);
        for (int32_t i = 0; collations.getKeyAndValue(i, key, value); ++i) {
            UResType type = value.getType();
            if (type == URES_STRING) {
                if (!hasDefault && uprv_strcmp(key, "default") == 0) {
                    CharString defcoll;
                    defcoll.appendInvariantChars(value.getUnicodeString(errorCode), errorCode);
                    if (U_SUCCESS(errorCode) && !defcoll.isEmpty()) {
                        char *ownedDefault = uprv_strdup(defcoll.data());
                        if (ownedDefault == NULL) {
                            errorCode = U_MEMORY_ALLOCATION_ERROR;
                            return;
                        }
                        ulist_removeString(values, defcoll.data());
                        ulist_addItemBeginList(values, ownedDefault, TRUE, &errorCode);
                        hasDefault = TRUE;
                    }
                }
            } else if (type == URES_TABLE && uprv_strncmp(key, "private-", 8) != 0) {
                if (!ulist_containsString(values, key, (int32_t)uprv_strlen(key))) {
                    ulist_addItemEndList(values, key, FALSE, &errorCode);
                }
            }
            if (U_FAILURE(errorCode)) { return; }
        }
    }